

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reinsertion_optimizer.h
# Opt level: O0

void __thiscall
bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
optimize<bvh::v2::ParallelExecutor>
          (ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this,
          Executor<bvh::v2::ParallelExecutor> *executor,Config *config)

{
  _Bit_pointer *ppuVar1;
  ThreadPool *this_00;
  ulong uVar2;
  value_type *__n;
  Config *pCVar3;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Index<32UL,_4UL> IVar7;
  bool bVar8;
  size_type sVar9;
  unsigned_long *puVar10;
  reference pvVar11;
  reference pvVar12;
  size_t sVar13;
  iterator iVar14;
  iterator iVar15;
  reference pvVar16;
  iterator __first;
  iterator __last;
  reference pvVar17;
  Task *task;
  undefined1 auVar18 [16];
  undefined1 in_ZMM0 [64];
  iterator iVar19;
  reference rVar20;
  _Bit_iterator __first_00;
  _Bit_iterator __last_00;
  size_t local_13e8;
  size_type local_13d8;
  unsigned_long local_1398;
  reference local_12b8;
  size_type local_12a8;
  value_type_conflict conflict;
  iterator __end0_1;
  iterator __begin0_1;
  array<unsigned_long,_5UL> *__range5;
  undefined1 local_1280 [8];
  array<unsigned_long,_5UL> conflicts;
  Reinsertion *reinsertion;
  iterator __end0;
  iterator __begin0;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  *__range4;
  __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
  local_1218;
  const_iterator local_1210;
  Reinsertion *local_1200;
  Reinsertion *local_11f8;
  __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
  local_11f0;
  const_iterator local_11e8;
  anon_class_24_3_b752b870 local_11e0;
  bool local_11c1;
  _Bit_type *local_11c0;
  uint local_11b8;
  _Bit_type *local_11b0;
  uint local_11a8;
  _Bit_type *local_11a0;
  uint local_1198;
  _Bit_type *local_1190;
  uint local_1188;
  undefined1 local_1180 [8];
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  candidates;
  size_t iter;
  allocator<bool> local_1149;
  undefined1 local_1148 [8];
  vector<bool,_std::allocator<bool>_> touched;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  reinsertions;
  unsigned_long local_1100;
  unsigned_long local_10f8;
  unsigned_long batch_size;
  Config *config_local;
  Executor<bvh::v2::ParallelExecutor> *executor_local;
  ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *this_local;
  Candidate *local_10d0;
  size_t local_10c8;
  Scalar local_10c0;
  Candidate *local_10b8;
  Candidate *local_10b0;
  Vec<float,_3UL> local_10a4;
  Vec<float,_3UL> local_1098;
  float local_108c;
  ulong uStack_1088;
  float cost;
  size_t i_1;
  Candidate *local_1078;
  Vec<float,_3UL> local_1060;
  Vec<float,_3UL> local_1054;
  value_type local_1048;
  size_type local_1038;
  size_t i;
  unsigned_long local_1028;
  size_type local_1020;
  unsigned_long local_1018;
  unsigned_long node_count;
  ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_1008;
  undefined1 *local_1000;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  *candidates_1;
  float local_ff0;
  undefined8 local_fe4;
  Vec<float,_3UL> d_1;
  anon_class_16_2_94731e0a local_f28;
  Vec<float,_3UL> *local_f18;
  Vec<float,_3UL> *local_f10;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  *local_f08;
  float local_f00;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  *local_ef8;
  float local_ef0;
  anon_class_16_2_94732099 local_ee8;
  anon_class_16_2_94731e0a *local_ed8;
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  *local_ecc;
  Vec<float,_3UL> v_5;
  float local_e90;
  float fStack_e8c;
  Vec<float,_3UL> d;
  anon_class_16_2_94731e0a local_dd0;
  Vec<float,_3UL> *local_dc0;
  Vec<float,_3UL> *local_db8;
  undefined8 local_db0;
  float local_da8;
  undefined8 local_da0;
  float local_d98;
  anon_class_16_2_94732099 local_d90;
  anon_class_16_2_94731e0a *local_d80;
  undefined1 local_d74 [8];
  Vec<float,_3UL> v_2;
  anon_class_8_1_8991fb9c local_d38;
  float local_d30 [2];
  float local_d28;
  float local_d20 [2];
  float local_d18;
  anon_class_8_1_8991fb9c local_d10;
  float local_d08 [2];
  float local_d00;
  reference local_cf8;
  float *local_cf0;
  float *local_ce8;
  Vec<float,_3UL> *local_ce0;
  float local_cd8 [2];
  float local_cd0;
  anon_class_8_1_8991fb9c local_cc8;
  float local_cc0 [2];
  float local_cb8;
  float local_cb0 [2];
  float local_ca8;
  anon_class_8_1_8991fb9c local_ca0;
  float local_c98 [2];
  float local_c90;
  reference local_c88;
  float *local_c80;
  float *local_c78;
  Vec<float,_3UL> *local_c70;
  float local_c68 [2];
  float local_c60;
  anon_class_16_2_94732099 local_c58;
  anon_class_8_1_8991fb9c *local_c48;
  undefined1 local_c3c [8];
  Vec<float,_3UL> v;
  anon_class_16_2_94732099 local_c20;
  anon_class_8_1_8991fb9c *local_c10;
  undefined1 local_c04 [8];
  Vec<float,_3UL> v_3;
  anon_class_16_2_94732099 local_be8;
  anon_class_8_1_8991fb9c *local_bd8;
  undefined1 local_bcc [8];
  Vec<float,_3UL> v_1;
  anon_class_16_2_94732099 local_bb0;
  anon_class_8_1_8991fb9c *local_ba0;
  undefined1 local_b94 [8];
  Vec<float,_3UL> v_4;
  undefined8 local_ae8;
  value_type dst_node;
  value_type sibling_node;
  value_type parent_id;
  size_t sibling_id;
  Index<32UL,_4UL> local_a7c;
  float *local_a78;
  undefined8 *local_a70;
  float *local_a68;
  float *local_a60;
  float *local_a58;
  float *local_a50;
  float *local_a48;
  float *local_a40;
  float *local_a38;
  float *local_a30;
  ulong local_a28;
  ulong local_a20;
  ulong local_a18;
  ulong local_a10;
  ulong local_a08;
  ulong local_a00;
  Vec<float,_3UL> local_9f8 [2];
  BBox<float,_3UL> local_9e0;
  reference local_9c8;
  value_type *node_1;
  ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_9b8;
  float local_9b0 [2];
  float local_9a8;
  float local_99c [2];
  float local_994;
  float local_990 [2];
  float local_988;
  float local_980 [2];
  float local_978;
  Vec<float,_3UL> *local_970;
  BBox<float,_3UL> *local_968;
  float local_960 [2];
  float local_958;
  float local_950 [2];
  float local_948;
  anon_class_16_2_94731e0a local_940;
  Vec<float,_3UL> *local_930;
  BBox<float,_3UL> *local_928;
  float local_920 [2];
  float local_918;
  float local_910 [2];
  float local_908;
  float local_900 [2];
  float local_8f8;
  anon_class_16_2_94731e0a local_8f0;
  Vec<float,_3UL> *local_8e0;
  Vec<float,_3UL> *local_8d8;
  float local_8d0 [2];
  float local_8c8;
  float local_8c0 [2];
  float local_8b8;
  anon_class_16_2_94732099 local_8b0;
  anon_class_16_2_94731e0a *local_8a0;
  undefined1 local_894 [8];
  Vec<float,_3UL> v_16;
  anon_class_16_2_94732099 local_858;
  anon_class_16_2_94731e0a *local_848;
  undefined1 local_83c [8];
  Vec<float,_3UL> v_17;
  anon_class_16_2_3fddf3e4 local_810;
  BBox<float,_3UL> *local_800;
  reference local_7f8;
  float local_7f0 [2];
  float local_7e8;
  anon_class_8_1_8991fb9c local_7e0;
  float local_7d8 [2];
  float local_7d0;
  float local_7c8 [2];
  float local_7c0;
  anon_class_8_1_8991fb9c local_7b8;
  float local_7b0 [2];
  float local_7a8;
  reference local_7a0;
  float *local_798;
  float *local_790;
  Vec<float,_3UL> *local_788;
  float local_780 [2];
  float local_778;
  anon_class_8_1_8991fb9c local_770;
  float local_768 [2];
  float local_760;
  float local_758 [2];
  float local_750;
  anon_class_8_1_8991fb9c local_748;
  float local_740 [2];
  float local_738;
  reference local_730;
  float *local_728;
  float *local_720;
  BBox<float,_3UL> *local_718;
  anon_class_16_2_3fddf3e4 *local_710;
  anon_class_16_2_3fddf3e4 *local_708;
  anon_class_16_2_3fddf3e4 *local_700;
  anon_class_16_2_3fddf3e4 *local_6f8;
  float local_6f0 [2];
  float local_6e8;
  anon_class_16_2_94732099 local_6e0;
  anon_class_8_1_8991fb9c *local_6d0;
  undefined1 local_6c4 [8];
  Vec<float,_3UL> v_12;
  anon_class_16_2_94732099 local_6a8;
  anon_class_8_1_8991fb9c *local_698;
  undefined1 local_68c [8];
  Vec<float,_3UL> v_14;
  anon_class_16_2_94732099 local_670;
  anon_class_8_1_8991fb9c *local_660;
  undefined1 local_654 [8];
  Vec<float,_3UL> v_13;
  anon_class_16_2_94732099 local_638;
  anon_class_8_1_8991fb9c *local_628;
  undefined1 local_61c [8];
  Vec<float,_3UL> v_15;
  Vec<float,_3UL> local_568 [2];
  BBox<float,_3UL> local_550;
  reference local_538;
  value_type *node;
  ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_528;
  float local_520 [2];
  float local_518;
  float local_50c [2];
  float local_504;
  float local_500 [2];
  float local_4f8;
  float local_4f0 [2];
  float local_4e8;
  Vec<float,_3UL> *local_4e0;
  BBox<float,_3UL> *local_4d8;
  float local_4d0 [2];
  float local_4c8;
  float local_4c0 [2];
  float local_4b8;
  anon_class_16_2_94731e0a local_4b0;
  Vec<float,_3UL> *local_4a0;
  BBox<float,_3UL> *local_498;
  float local_490 [2];
  float local_488;
  float local_480 [2];
  float local_478;
  float local_470 [2];
  float local_468;
  anon_class_16_2_94731e0a local_460;
  Vec<float,_3UL> *local_450;
  Vec<float,_3UL> *local_448;
  float local_440 [2];
  float local_438;
  float local_430 [2];
  float local_428;
  anon_class_16_2_94732099 local_420;
  anon_class_16_2_94731e0a *local_410;
  undefined1 local_404 [8];
  Vec<float,_3UL> v_10;
  anon_class_16_2_94732099 local_3c8;
  anon_class_16_2_94731e0a *local_3b8;
  undefined1 local_3ac [8];
  Vec<float,_3UL> v_11;
  anon_class_16_2_3fddf3e4 local_380;
  BBox<float,_3UL> *local_370;
  reference local_368;
  float local_360 [2];
  float local_358;
  anon_class_8_1_8991fb9c local_350;
  float local_348 [2];
  float local_340;
  float local_338 [2];
  float local_330;
  anon_class_8_1_8991fb9c local_328;
  float local_320 [2];
  float local_318;
  reference local_310;
  float *local_308;
  float *local_300;
  Vec<float,_3UL> *local_2f8;
  float local_2f0 [2];
  float local_2e8;
  anon_class_8_1_8991fb9c local_2e0;
  float local_2d8 [2];
  float local_2d0;
  float local_2c8 [2];
  float local_2c0;
  anon_class_8_1_8991fb9c local_2b8;
  float local_2b0 [2];
  float local_2a8;
  reference local_2a0;
  float *local_298;
  float *local_290;
  BBox<float,_3UL> *local_288;
  anon_class_16_2_3fddf3e4 *local_280;
  anon_class_16_2_3fddf3e4 *local_278;
  anon_class_16_2_3fddf3e4 *local_270;
  anon_class_16_2_3fddf3e4 *local_268;
  float local_260 [2];
  float local_258;
  anon_class_16_2_94732099 local_250;
  anon_class_8_1_8991fb9c *local_240;
  undefined1 local_234 [8];
  Vec<float,_3UL> v_6;
  anon_class_16_2_94732099 local_218;
  anon_class_8_1_8991fb9c *local_208;
  undefined1 local_1fc [8];
  Vec<float,_3UL> v_8;
  anon_class_16_2_94732099 local_1e0;
  anon_class_8_1_8991fb9c *local_1d0;
  undefined1 local_1c4 [8];
  Vec<float,_3UL> v_7;
  anon_class_16_2_94732099 local_1a8;
  anon_class_8_1_8991fb9c *local_198;
  undefined1 local_18c [8];
  Vec<float,_3UL> v_9;
  undefined1 local_a8 [16];
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
  *local_98;
  size_t local_90;
  unsigned_long local_88;
  function<void_(unsigned_long)> local_78;
  _Manager_type local_58;
  unsigned_long local_50;
  size_t next;
  size_t i_2;
  unsigned_long local_38;
  _Manager_type local_30;
  unsigned_long chunk_size;
  size_type local_20;
  size_t local_18;
  Config *local_10;
  
  auVar18 = in_ZMM0._0_16_;
  local_1100 = 1;
  batch_size = (unsigned_long)config;
  config_local = (Config *)executor;
  executor_local = (Executor<bvh::v2::ParallelExecutor> *)this;
  sVar9 = std::
          vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
          ::size(&this->bvh_->nodes);
  auVar18 = vcvtusi2ss_avx512f(auVar18,sVar9);
  reinsertions.
  super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)vcvttss2usi_avx512f(ZEXT416((uint)(auVar18._0_4_ * *(float *)batch_size)));
  puVar10 = std::max<unsigned_long>
                      (&local_1100,
                       (unsigned_long *)
                       &reinsertions.
                        super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_10f8 = *puVar10;
  std::
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ::vector((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
            *)&touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage);
  sVar9 = std::
          vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
          ::size(&this->bvh_->nodes);
  std::allocator<bool>::allocator(&local_1149);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_1148,sVar9,&local_1149);
  std::allocator<bool>::~allocator(&local_1149);
  for (candidates.
       super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      candidates.
      super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < *(pointer *)(batch_size + 8);
      candidates.
      super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(candidates.
                             super__Vector_base<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->node_id + 1)) {
    local_1000 = local_1180;
    node_count = local_10f8;
    local_1008 = this;
    local_1020 = std::
                 vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ::size(&this->bvh_->nodes);
    local_1028 = node_count + 1;
    puVar10 = std::min<unsigned_long>(&local_1020,&local_1028);
    local_1018 = *puVar10;
    i._7_1_ = 0;
    std::
    vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
    ::vector((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
              *)local_1180);
    for (local_1038 = 1; local_1038 < local_1018; local_1038 = local_1038 + 1) {
      local_1048.node_id = local_1038;
      pvVar11 = std::
                vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ::operator[](&this->bvh_->nodes,local_1038);
      local_c58.f = &local_ca0;
      local_c58.v = (Vec<float,_3UL> *)local_c3c;
      local_ca0.this = pvVar11;
      local_c88 = pvVar11;
      local_c48 = local_c58.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()(&local_c58,0);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()(&local_c58,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()(&local_c58,2);
      local_c60 = v.values[0];
      local_c68[0] = (float)local_c3c._0_4_;
      local_c68[1] = (float)local_c3c._4_4_;
      local_ca8 = v.values[0];
      local_cb0[0] = (float)local_c3c._0_4_;
      local_cb0[1] = (float)local_c3c._4_4_;
      local_c90 = v.values[0];
      local_c98[0] = (float)local_c3c._0_4_;
      local_c98[1] = (float)local_c3c._4_4_;
      local_be8.f = &local_cc8;
      local_be8.v = (Vec<float,_3UL> *)local_bcc;
      local_cc8.this = pvVar11;
      local_bd8 = local_be8.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_be8,0);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_be8,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_be8,2);
      v_3.values[1] = (float)local_bcc._0_4_;
      v_3.values[2] = (float)local_bcc._4_4_;
      local_cd0 = v_1.values[0];
      local_cd8[0] = (float)local_bcc._0_4_;
      local_cd8[1] = (float)local_bcc._4_4_;
      local_cb8 = v_1.values[0];
      local_cc0[0] = (float)local_bcc._0_4_;
      local_cc0[1] = (float)local_bcc._4_4_;
      local_dd0.b = &local_1060;
      local_c78 = local_c98;
      local_c80 = local_cc0;
      local_1060.values[2] = local_c90;
      local_1060.values[0] = local_c98[0];
      local_1060.values[1] = local_c98[1];
      local_dd0.a = &local_1054;
      local_d90.f = &local_dd0;
      local_d90.v = (Vec<float,_3UL> *)local_d74;
      v_2.values._4_8_ = &local_d90;
      local_dc0 = local_dd0.b;
      local_db8 = local_dd0.a;
      local_d80 = local_d90.f;
      local_c70 = local_dd0.b;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_2.values._4_8_,0);
      uVar5 = v_2.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_2.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
      local_d98 = v_2.values[0];
      local_da0 = local_d74;
      local_da8 = v_2.values[0];
      local_db0 = local_d74;
      local_e90 = local_d74._0_4_;
      fStack_e8c = local_d74._4_4_;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)v_2.values[0]),ZEXT416((uint)(local_e90 + fStack_e8c))
                                ,ZEXT416((uint)(local_e90 * fStack_e8c)));
      local_1048.cost = auVar18._0_4_;
      std::
      vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
      ::push_back((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                   *)local_1180,&local_1048);
    }
    local_1078 = (Candidate *)
                 std::
                 vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                 ::begin((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                          *)local_1180);
    i_1 = (size_t)std::
                  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                  ::end((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                         *)local_1180);
    std::
    make_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,std::greater<void>>
              (local_1078,i_1);
    uStack_1088 = local_1018;
    while( true ) {
      uVar2 = uStack_1088;
      sVar9 = std::
              vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ::size(&this->bvh_->nodes);
      if (sVar9 <= uVar2) break;
      pvVar11 = std::
                vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ::operator[](&this->bvh_->nodes,uStack_1088);
      local_c20.f = &local_d10;
      local_c20.v = (Vec<float,_3UL> *)local_c04;
      v_4.values._4_8_ = &local_c20;
      local_d10.this = pvVar11;
      local_cf8 = pvVar11;
      local_c10 = local_c20.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_4.values._4_8_,0);
      uVar5 = v_4.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_4.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
      v.values[1] = (float)local_c04._0_4_;
      v.values[2] = (float)local_c04._4_4_;
      local_d18 = v_3.values[0];
      local_d20[0] = (float)local_c04._0_4_;
      local_d20[1] = (float)local_c04._4_4_;
      local_d00 = v_3.values[0];
      local_d08[0] = (float)local_c04._0_4_;
      local_d08[1] = (float)local_c04._4_4_;
      local_bb0.f = &local_d38;
      local_bb0.v = (Vec<float,_3UL> *)local_b94;
      local_d38.this = pvVar11;
      local_ba0 = local_bb0.f;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_bb0,0);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_bb0,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
      ::anon_class_16_2_94732099::operator()(&local_bb0,2);
      v_1.values[1] = (float)local_b94._0_4_;
      v_1.values[2] = (float)local_b94._4_4_;
      local_d28 = v_4.values[0];
      local_d30[0] = (float)local_b94._0_4_;
      local_d30[1] = (float)local_b94._4_4_;
      d_1.values._4_8_ = &local_10a4;
      local_ce8 = local_d08;
      local_cf0 = local_d30;
      local_10a4.values[2] = local_d00;
      local_10a4.values[0] = local_d08[0];
      local_10a4.values[1] = local_d08[1];
      local_f28.a = &local_1098;
      local_ee8.f = &local_f28;
      local_ee8.v = (Vec<float,_3UL> *)&local_ecc;
      v_5.values._4_8_ = &local_ee8;
      local_f28.b = (Vec<float,_3UL> *)d_1.values._4_8_;
      local_f18 = (Vec<float,_3UL> *)d_1.values._4_8_;
      local_f10 = local_f28.a;
      local_ed8 = local_ee8.f;
      local_ce0 = (Vec<float,_3UL> *)d_1.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_5.values._4_8_,0);
      uVar5 = v_5.values._4_8_;
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_5.values._4_8_,1);
      Vec<float,_3UL>::
      generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:54:32)>
      ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
      local_ef0 = v_5.values[0];
      local_ef8 = local_ecc;
      local_f00 = v_5.values[0];
      local_f08 = local_ecc;
      local_ff0 = v_5.values[0];
      candidates_1 = local_ecc;
      local_fe4 = local_ecc;
      pvVar4 = local_fe4;
      d_1.values[0] = v_5.values[0];
      local_fe4._0_4_ = SUB84(local_ecc,0);
      local_fe4._4_4_ = (float)((ulong)local_ecc >> 0x20);
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)v_5.values[0]),
                                ZEXT416((uint)((float)local_fe4 + local_fe4._4_4_)),
                                ZEXT416((uint)((float)local_fe4 * local_fe4._4_4_)));
      local_108c = auVar18._0_4_;
      local_fe4 = pvVar4;
      pvVar12 = std::
                vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                ::front((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                         *)local_1180);
      if (pvVar12->cost < local_108c) {
        local_10b0 = (Candidate *)
                     std::
                     vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                     ::begin((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                              *)local_1180);
        local_10b8 = (Candidate *)
                     std::
                     vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                     ::end((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                            *)local_1180);
        std::
        pop_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,std::greater<void>>
                  (local_10b0,local_10b8);
        local_10c8 = uStack_1088;
        local_10c0 = local_108c;
        pvVar12 = std::
                  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                  ::back((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                          *)local_1180);
        pvVar12->cost = local_10c0;
        pvVar12->node_id = local_10c8;
        local_10d0 = (Candidate *)
                     std::
                     vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                     ::begin((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                              *)local_1180);
        this_local = (ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)
                     std::
                     vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                     ::end((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                            *)local_1180);
        std::
        push_heap<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Candidate>>>,std::greater<void>>
                  (local_10d0,this_local);
      }
      uStack_1088 = uStack_1088 + 1;
    }
    i._7_1_ = 1;
    iVar19 = std::vector<bool,_std::allocator<bool>_>::begin
                       ((vector<bool,_std::allocator<bool>_> *)local_1148);
    local_11a0 = iVar19.super__Bit_iterator_base._M_p;
    local_1198 = iVar19.super__Bit_iterator_base._M_offset;
    local_1190 = local_11a0;
    local_1188 = local_1198;
    iVar19 = std::vector<bool,_std::allocator<bool>_>::end
                       ((vector<bool,_std::allocator<bool>_> *)local_1148);
    local_11c0 = iVar19.super__Bit_iterator_base._M_p;
    local_11b8 = iVar19.super__Bit_iterator_base._M_offset;
    local_11c1 = false;
    __first_00.super__Bit_iterator_base._M_offset = local_1188;
    __first_00.super__Bit_iterator_base._M_p = local_1190;
    __first_00.super__Bit_iterator_base._12_4_ = 0;
    __last_00.super__Bit_iterator_base._12_4_ = 0;
    __last_00.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar19.super__Bit_iterator_base._0_12_,0);
    __last_00.super__Bit_iterator_base._M_offset = SUB124(iVar19.super__Bit_iterator_base._0_12_,8);
    local_11b0 = local_11c0;
    local_11a8 = local_11b8;
    std::fill<std::_Bit_iterator,bool>(__first_00,__last_00,&local_11c1);
    sVar9 = std::
            vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
            ::size((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                    *)local_1180);
    std::
    vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
    ::resize((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
              *)&touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 ._M_end_of_storage,sVar9);
    pCVar3 = config_local;
    sVar9 = std::
            vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
            ::size((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                    *)local_1180);
    local_11e0.reinsertions =
         (vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
          *)&touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    local_11e0.candidates =
         (vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
          *)local_1180;
    chunk_size = (unsigned_long)&local_11e0;
    local_10 = pCVar3;
    local_18 = 0;
    local_11e0.this = this;
    local_20 = sVar9;
    if (sVar9 < pCVar3->max_iter_count) {
      optimize<bvh::v2::ParallelExecutor>::anon_class_24_3_b752b870::operator()
                ((anon_class_24_3_b752b870 *)chunk_size,0,sVar9);
    }
    else {
      local_38 = 1;
      sVar13 = ThreadPool::get_thread_count(*(ThreadPool **)pCVar3);
      i_2 = sVar9 / sVar13;
      task = (Task *)&i_2;
      puVar10 = std::max<unsigned_long>(&local_38,(unsigned_long *)task);
      local_30 = (_Manager_type)*puVar10;
      for (next = local_18; next < local_20; next = (size_t)(local_30 + next)) {
        local_58 = local_30 + next;
        puVar10 = std::min<unsigned_long>(&local_20,(unsigned_long *)&local_58);
        local_88 = *puVar10;
        this_00 = *(ThreadPool **)pCVar3;
        local_98 = *(vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
                     **)(chunk_size + 0x10);
        local_a8 = *(undefined1 (*) [16])chunk_size;
        local_90 = next;
        local_50 = local_88;
        std::function<void_(unsigned_long)>::
        function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_executor_h:58:30),_void>
                  (&local_78,(anon_class_40_3_92fce145_conflict1 *)local_a8);
        task = &local_78;
        ThreadPool::push(this_00,task);
        std::function<void_(unsigned_long)>::~function(&local_78);
      }
      ThreadPool::wait(*(ThreadPool **)pCVar3,task);
    }
    ppuVar1 = &touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
    local_11f8 = (Reinsertion *)
                 std::
                 vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                 ::begin((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                          *)ppuVar1);
    local_1200 = (Reinsertion *)
                 std::
                 vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                 ::end((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                        *)ppuVar1);
    local_11f0 = std::
                 remove_if<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::optimize<bvh::v2::ParallelExecutor>(bvh::v2::Executor<bvh::v2::ParallelExecutor>&,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(auto:1&)_1_>
                           (local_11f8,local_1200);
    __gnu_cxx::
    __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion_const*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>
    ::
    __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*>
              ((__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion_const*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>
                *)&local_11e8,&local_11f0);
    ppuVar1 = &touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
    local_1218._M_current =
         (Reinsertion *)
         std::
         vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
         ::end((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                *)ppuVar1);
    __gnu_cxx::
    __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion_const*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>
    ::
    __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*>
              ((__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion_const*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>
                *)&local_1210,&local_1218);
    std::
    vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
    ::erase((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
             *)ppuVar1,local_11e8,local_1210);
    ppuVar1 = &touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
    iVar14 = std::
             vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
             ::begin((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                      *)ppuVar1);
    iVar15 = std::
             vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
             ::end((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                    *)ppuVar1);
    std::
    sort<__gnu_cxx::__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion*,std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion,std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Reinsertion>>>,std::greater<void>>
              (iVar14._M_current,iVar15._M_current);
    ppuVar1 = &touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage;
    __end0 = std::
             vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
             ::begin((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                      *)ppuVar1);
    reinsertion = (Reinsertion *)
                  std::
                  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                  ::end((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
                         *)ppuVar1);
    while( true ) {
      bVar8 = __gnu_cxx::
              operator==<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
                        (&__end0,(__normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
                                  *)&reinsertion);
      if (((bVar8 ^ 0xffU) & 1) == 0) break;
      conflicts._M_elems[4] =
           (unsigned_long)
           __gnu_cxx::
           __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
           ::operator*(&__end0);
      uVar2 = ((reference)conflicts._M_elems[4])->from;
      local_1280 = (undefined1  [8])((reference)conflicts._M_elems[4])->to;
      if ((uVar2 & 1) == 1) {
        local_1398 = uVar2 + 1;
      }
      else {
        local_1398 = uVar2 - 1;
      }
      conflicts._M_elems[1] = local_1398;
      conflicts._M_elems[0] = uVar2;
      local_a20 = uVar2;
      local_a18 = uVar2;
      pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->parents_,(size_type)local_1280);
      conflicts._M_elems[2] = *pvVar16;
      pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&this->parents_,uVar2);
      conflicts._M_elems[3] = *pvVar16;
      __first = std::array<unsigned_long,_5UL>::begin((array<unsigned_long,_5UL> *)local_1280);
      __last = std::array<unsigned_long,_5UL>::end((array<unsigned_long,_5UL> *)local_1280);
      __range5 = (array<unsigned_long,_5UL> *)local_1148;
      bVar8 = std::
              any_of<unsigned_long*,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::optimize<bvh::v2::ParallelExecutor>(bvh::v2::Executor<bvh::v2::ParallelExecutor>&,bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long)_1_>
                        (__first,__last,(anon_class_8_1_3fb64afe_for__M_pred)__range5);
      if (!bVar8) {
        __begin0_1 = (iterator)local_1280;
        __end0_1 = std::array<unsigned_long,_5UL>::begin((array<unsigned_long,_5UL> *)__begin0_1);
        conflict = (value_type_conflict)
                   std::array<unsigned_long,_5UL>::end((array<unsigned_long,_5UL> *)__begin0_1);
        for (; __end0_1 != (iterator)conflict; __end0_1 = __end0_1 + 1) {
          local_12a8 = *__end0_1;
          rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_1148,local_12a8);
          local_12b8 = rVar20;
          std::_Bit_reference::operator=(&local_12b8,true);
        }
        uVar2 = *(ulong *)conflicts._M_elems[4];
        __n = *(value_type **)(conflicts._M_elems[4] + 8);
        if ((uVar2 & 1) == 1) {
          local_13d8 = uVar2 + 1;
        }
        else {
          local_13d8 = uVar2 - 1;
        }
        local_a28 = uVar2;
        local_a10 = uVar2;
        pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->parents_,uVar2);
        sibling_node._20_8_ = *pvVar16;
        pvVar11 = std::
                  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ::operator[](&this->bvh_->nodes,local_13d8);
        dst_node.bounds._M_elems[5] = (pvVar11->bounds)._M_elems[0];
        dst_node.index.value = (Type)(pvVar11->bounds)._M_elems[1];
        sibling_node.bounds._M_elems._0_8_ = *(undefined8 *)((pvVar11->bounds)._M_elems + 2);
        sibling_node.bounds._M_elems._8_8_ = *(undefined8 *)((pvVar11->bounds)._M_elems + 4);
        sibling_node.bounds._M_elems[4] = (float)(pvVar11->index).value;
        pvVar11 = std::
                  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ::operator[](&this->bvh_->nodes,(size_type)__n);
        local_ae8 = *(undefined8 *)(pvVar11->bounds)._M_elems;
        dst_node.bounds._M_elems._0_8_ = *(undefined8 *)((pvVar11->bounds)._M_elems + 2);
        dst_node.bounds._M_elems._8_8_ = *(undefined8 *)((pvVar11->bounds)._M_elems + 4);
        dst_node.bounds._M_elems[4] = (float)(pvVar11->index).value;
        local_13e8 = uVar2;
        if ((uVar2 & 1) != 1) {
          local_13e8 = uVar2 - 1;
        }
        local_a08 = uVar2;
        local_a00 = uVar2;
        Index<32UL,_4UL>::Index(&local_a7c,local_13e8,0);
        IVar7.value = local_a7c.value;
        pvVar11 = std::
                  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ::operator[](&this->bvh_->nodes,(size_type)__n);
        (pvVar11->index).value = IVar7.value;
        pvVar11 = std::
                  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ::operator[](&this->bvh_->nodes,local_13d8);
        *(undefined8 *)(pvVar11->bounds)._M_elems = local_ae8;
        *(undefined8 *)((pvVar11->bounds)._M_elems + 2) = dst_node.bounds._M_elems._0_8_;
        *(undefined8 *)((pvVar11->bounds)._M_elems + 4) = dst_node.bounds._M_elems._8_8_;
        (pvVar11->index).value = (Type)dst_node.bounds._M_elems[4];
        pvVar11 = std::
                  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                  ::operator[](&this->bvh_->nodes,sibling_node._20_8_);
        (pvVar11->bounds)._M_elems[0] = dst_node.bounds._M_elems[5];
        (pvVar11->bounds)._M_elems[1] = (float)dst_node.index.value;
        *(undefined8 *)((pvVar11->bounds)._M_elems + 2) = sibling_node.bounds._M_elems._0_8_;
        *(undefined8 *)((pvVar11->bounds)._M_elems + 4) = sibling_node.bounds._M_elems._8_8_;
        (pvVar11->index).value = (Type)sibling_node.bounds._M_elems[4];
        local_a70 = &local_ae8;
        local_a48 = dst_node.bounds._M_elems + 4;
        local_a30 = local_a48;
        if (((uint)dst_node.bounds._M_elems[4] & 0xf) == 0) {
          local_a50 = dst_node.bounds._M_elems + 4;
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->parents_,(ulong)((uint)dst_node.bounds._M_elems[4] >> 4));
          *pvVar16 = local_13d8;
          local_a58 = dst_node.bounds._M_elems + 4;
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->parents_,(ulong)(((uint)dst_node.bounds._M_elems[4] >> 4) + 1)
                              );
          *pvVar16 = local_13d8;
        }
        uVar5 = sibling_node._20_8_;
        local_a78 = dst_node.bounds._M_elems + 5;
        local_a40 = sibling_node.bounds._M_elems + 4;
        local_a38 = local_a40;
        if (((uint)sibling_node.bounds._M_elems[4] & 0xf) == 0) {
          local_a60 = sibling_node.bounds._M_elems + 4;
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->parents_,(ulong)((uint)sibling_node.bounds._M_elems[4] >> 4));
          uVar6 = sibling_node._20_8_;
          *pvVar16 = uVar5;
          local_a68 = sibling_node.bounds._M_elems + 4;
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->parents_,
                               (ulong)(((uint)sibling_node.bounds._M_elems[4] >> 4) + 1));
          *pvVar16 = uVar6;
        }
        pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->parents_,local_13d8);
        *pvVar16 = (value_type)__n;
        pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&this->parents_,uVar2);
        *pvVar16 = (value_type)__n;
        node = __n;
        local_528 = this;
        do {
          pvVar11 = std::
                    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ::operator[](&this->bvh_->nodes,(size_type)node);
          local_538 = pvVar11;
          if (((pvVar11->index).value & 0xf) == 0) {
            pvVar17 = std::
                      vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ::operator[](&this->bvh_->nodes,(ulong)((pvVar11->index).value >> 4));
            local_250.f = &local_2b8;
            local_250.v = (Vec<float,_3UL> *)local_234;
            local_2b8.this = pvVar17;
            local_2a0 = pvVar17;
            local_240 = local_250.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()(&local_250,0);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()(&local_250,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()(&local_250,2);
            local_258 = v_6.values[0];
            local_260[0] = (float)local_234._0_4_;
            local_260[1] = (float)local_234._4_4_;
            local_2c0 = v_6.values[0];
            local_2c8[0] = (float)local_234._0_4_;
            local_2c8[1] = (float)local_234._4_4_;
            local_2a8 = v_6.values[0];
            local_2b0[0] = (float)local_234._0_4_;
            local_2b0[1] = (float)local_234._4_4_;
            local_1e0.f = &local_2e0;
            local_1e0.v = (Vec<float,_3UL> *)local_1c4;
            local_2e0.this = pvVar17;
            local_1d0 = local_1e0.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_1e0,0);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_1e0,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_1e0,2);
            v_8.values[1] = (float)local_1c4._0_4_;
            v_8.values[2] = (float)local_1c4._4_4_;
            local_2e8 = v_7.values[0];
            local_2f0[0] = (float)local_1c4._0_4_;
            local_2f0[1] = (float)local_1c4._4_4_;
            local_2d0 = v_7.values[0];
            local_2d8[0] = (float)local_1c4._0_4_;
            local_2d8[1] = (float)local_1c4._4_4_;
            local_288 = &local_550;
            local_290 = local_2b0;
            local_298 = local_2d8;
            local_550.min.values[2] = local_2a8;
            local_550.min.values[0] = local_2b0[0];
            local_550.min.values[1] = local_2b0[1];
            pvVar17 = std::
                      vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ::operator[](&this->bvh_->nodes,(ulong)(((local_538->index).value >> 4) + 1));
            local_218.f = &local_328;
            local_218.v = (Vec<float,_3UL> *)local_1fc;
            v_9.values._4_8_ = &local_218;
            local_328.this = pvVar17;
            local_310 = pvVar17;
            local_208 = local_218.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_9.values._4_8_,0);
            uVar5 = v_9.values._4_8_;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_9.values._4_8_,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
            v_6.values[1] = (float)local_1fc._0_4_;
            v_6.values[2] = (float)local_1fc._4_4_;
            local_330 = v_8.values[0];
            local_338[0] = (float)local_1fc._0_4_;
            local_338[1] = (float)local_1fc._4_4_;
            local_318 = v_8.values[0];
            local_320[0] = (float)local_1fc._0_4_;
            local_320[1] = (float)local_1fc._4_4_;
            local_1a8.f = &local_350;
            local_1a8.v = (Vec<float,_3UL> *)local_18c;
            local_350.this = pvVar17;
            local_198 = local_1a8.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_1a8,0);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_1a8,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_1a8,2);
            v_7.values[1] = (float)local_18c._0_4_;
            v_7.values[2] = (float)local_18c._4_4_;
            local_358 = v_9.values[0];
            local_360[0] = (float)local_18c._0_4_;
            local_360[1] = (float)local_18c._4_4_;
            local_340 = v_9.values[0];
            local_348[0] = (float)local_18c._0_4_;
            local_348[1] = (float)local_18c._4_4_;
            local_4e0 = local_568;
            local_300 = local_320;
            local_308 = local_348;
            local_568[0].values[2] = local_318;
            local_568[0].values[0] = local_320[0];
            local_568[0].values[1] = local_320[1];
            local_420.f = &local_4b0;
            local_420.v = (Vec<float,_3UL> *)local_404;
            v_10.values._4_8_ = &local_420;
            local_4d8 = &local_550;
            local_4b0.a = &local_550.min;
            local_4b0.b = local_4e0;
            local_4a0 = local_4e0;
            local_498 = &local_550;
            local_410 = local_420.f;
            local_2f8 = local_4e0;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_10.values._4_8_,0);
            uVar5 = v_10.values._4_8_;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_10.values._4_8_,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
            local_428 = v_10.values[0];
            local_430[0] = (float)local_404._0_4_;
            local_430[1] = (float)local_404._4_4_;
            local_4b8 = v_10.values[0];
            local_4c0[0] = (float)local_404._0_4_;
            local_4c0[1] = (float)local_404._4_4_;
            local_488 = v_10.values[0];
            local_490[0] = (float)local_404._0_4_;
            local_490[1] = (float)local_404._4_4_;
            local_4c8 = v_10.values[0];
            local_4d0[0] = (float)local_404._0_4_;
            local_4d0[1] = (float)local_404._4_4_;
            local_4f8 = v_10.values[0];
            local_500[0] = (float)local_404._0_4_;
            local_500[1] = (float)local_404._4_4_;
            local_4e8 = v_10.values[0];
            local_4f0[0] = (float)local_404._0_4_;
            local_4f0[1] = (float)local_404._4_4_;
            local_550.min.values[2] = v_10.values[0];
            local_550.min.values[0] = (float)local_404._0_4_;
            local_550.min.values[1] = (float)local_404._4_4_;
            local_460.a = &local_550.max;
            local_460.b = local_4e0 + 1;
            local_3c8.f = &local_460;
            local_3c8.v = (Vec<float,_3UL> *)local_3ac;
            v_11.values._4_8_ = &local_3c8;
            local_450 = local_460.b;
            local_448 = local_460.a;
            local_3b8 = local_3c8.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_11.values._4_8_,0);
            uVar5 = v_11.values._4_8_;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_11.values._4_8_,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
            local_468 = v_11.values[0];
            local_470[0] = (float)local_3ac._0_4_;
            local_470[1] = (float)local_3ac._4_4_;
            local_438 = v_11.values[0];
            local_440[0] = (float)local_3ac._0_4_;
            local_440[1] = (float)local_3ac._4_4_;
            local_478 = v_11.values[0];
            local_480[0] = (float)local_3ac._0_4_;
            local_480[1] = (float)local_3ac._4_4_;
            local_518 = v_11.values[0];
            local_520[0] = (float)local_3ac._0_4_;
            local_520[1] = (float)local_3ac._4_4_;
            local_50c[0] = (float)local_3ac._0_4_;
            local_50c[1] = (float)local_3ac._4_4_;
            local_504 = v_11.values[0];
            local_550.max.values[0] = (float)local_3ac._0_4_;
            local_550.max.values[1] = (float)local_3ac._4_4_;
            local_550.max.values[2] = v_11.values[0];
            local_280 = &local_380;
            local_380.this = pvVar11;
            local_380.bbox = &local_550;
            local_370 = &local_550;
            local_368 = pvVar11;
            Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_280,0)
            ;
            local_278 = local_280;
            Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_280,1)
            ;
            local_270 = local_278;
            Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_278,2)
            ;
            local_268 = local_270;
          }
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->parents_,(size_type)node);
          node = (value_type *)*pvVar16;
        } while (node != (value_type *)0x0);
        node_1 = (value_type *)sibling_node._20_8_;
        node = (value_type *)0x0;
        local_9b8 = this;
        do {
          pvVar11 = std::
                    vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                    ::operator[](&this->bvh_->nodes,(size_type)node_1);
          local_9c8 = pvVar11;
          if (((pvVar11->index).value & 0xf) == 0) {
            pvVar17 = std::
                      vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ::operator[](&this->bvh_->nodes,(ulong)((pvVar11->index).value >> 4));
            local_6e0.f = &local_748;
            local_6e0.v = (Vec<float,_3UL> *)local_6c4;
            local_748.this = pvVar17;
            local_730 = pvVar17;
            local_6d0 = local_6e0.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()(&local_6e0,0);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()(&local_6e0,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()(&local_6e0,2);
            local_6e8 = v_12.values[0];
            local_6f0[0] = (float)local_6c4._0_4_;
            local_6f0[1] = (float)local_6c4._4_4_;
            local_750 = v_12.values[0];
            local_758[0] = (float)local_6c4._0_4_;
            local_758[1] = (float)local_6c4._4_4_;
            local_738 = v_12.values[0];
            local_740[0] = (float)local_6c4._0_4_;
            local_740[1] = (float)local_6c4._4_4_;
            local_670.f = &local_770;
            local_670.v = (Vec<float,_3UL> *)local_654;
            local_770.this = pvVar17;
            local_660 = local_670.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_670,0);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_670,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_670,2);
            v_14.values[1] = (float)local_654._0_4_;
            v_14.values[2] = (float)local_654._4_4_;
            local_778 = v_13.values[0];
            local_780[0] = (float)local_654._0_4_;
            local_780[1] = (float)local_654._4_4_;
            local_760 = v_13.values[0];
            local_768[0] = (float)local_654._0_4_;
            local_768[1] = (float)local_654._4_4_;
            local_718 = &local_9e0;
            local_720 = local_740;
            local_728 = local_768;
            local_9e0.min.values[2] = local_738;
            local_9e0.min.values[0] = local_740[0];
            local_9e0.min.values[1] = local_740[1];
            pvVar17 = std::
                      vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ::operator[](&this->bvh_->nodes,(ulong)(((local_9c8->index).value >> 4) + 1));
            local_6a8.f = &local_7b8;
            local_6a8.v = (Vec<float,_3UL> *)local_68c;
            v_15.values._4_8_ = &local_6a8;
            local_7b8.this = pvVar17;
            local_7a0 = pvVar17;
            local_698 = local_6a8.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_15.values._4_8_,0);
            uVar5 = v_15.values._4_8_;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_15.values._4_8_,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
            v_12.values[1] = (float)local_68c._0_4_;
            v_12.values[2] = (float)local_68c._4_4_;
            local_7c0 = v_14.values[0];
            local_7c8[0] = (float)local_68c._0_4_;
            local_7c8[1] = (float)local_68c._4_4_;
            local_7a8 = v_14.values[0];
            local_7b0[0] = (float)local_68c._0_4_;
            local_7b0[1] = (float)local_68c._4_4_;
            local_638.f = &local_7e0;
            local_638.v = (Vec<float,_3UL> *)local_61c;
            local_7e0.this = pvVar17;
            local_628 = local_638.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_638,0);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_638,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
            ::anon_class_16_2_94732099::operator()(&local_638,2);
            v_13.values[1] = (float)local_61c._0_4_;
            v_13.values[2] = (float)local_61c._4_4_;
            local_7e8 = v_15.values[0];
            local_7f0[0] = (float)local_61c._0_4_;
            local_7f0[1] = (float)local_61c._4_4_;
            local_7d0 = v_15.values[0];
            local_7d8[0] = (float)local_61c._0_4_;
            local_7d8[1] = (float)local_61c._4_4_;
            local_970 = local_9f8;
            local_790 = local_7b0;
            local_798 = local_7d8;
            local_9f8[0].values[2] = local_7a8;
            local_9f8[0].values[0] = local_7b0[0];
            local_9f8[0].values[1] = local_7b0[1];
            local_8b0.f = &local_940;
            local_8b0.v = (Vec<float,_3UL> *)local_894;
            v_16.values._4_8_ = &local_8b0;
            local_968 = &local_9e0;
            local_940.a = &local_9e0.min;
            local_940.b = local_970;
            local_930 = local_970;
            local_928 = &local_9e0;
            local_8a0 = local_8b0.f;
            local_788 = local_970;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_16.values._4_8_,0);
            uVar5 = v_16.values._4_8_;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_16.values._4_8_,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:89:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
            local_8b8 = v_16.values[0];
            local_8c0[0] = (float)local_894._0_4_;
            local_8c0[1] = (float)local_894._4_4_;
            local_948 = v_16.values[0];
            local_950[0] = (float)local_894._0_4_;
            local_950[1] = (float)local_894._4_4_;
            local_918 = v_16.values[0];
            local_920[0] = (float)local_894._0_4_;
            local_920[1] = (float)local_894._4_4_;
            local_958 = v_16.values[0];
            local_960[0] = (float)local_894._0_4_;
            local_960[1] = (float)local_894._4_4_;
            local_988 = v_16.values[0];
            local_990[0] = (float)local_894._0_4_;
            local_990[1] = (float)local_894._4_4_;
            local_978 = v_16.values[0];
            local_980[0] = (float)local_894._0_4_;
            local_980[1] = (float)local_894._4_4_;
            local_9e0.min.values[2] = v_16.values[0];
            local_9e0.min.values[0] = (float)local_894._0_4_;
            local_9e0.min.values[1] = (float)local_894._4_4_;
            local_8f0.a = &local_9e0.max;
            local_8f0.b = local_970 + 1;
            local_858.f = &local_8f0;
            local_858.v = (Vec<float,_3UL> *)local_83c;
            v_17.values._4_8_ = &local_858;
            local_8e0 = local_8f0.b;
            local_8d8 = local_8f0.a;
            local_848 = local_858.f;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_17.values._4_8_,0);
            uVar5 = v_17.values._4_8_;
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_17.values._4_8_,1);
            Vec<float,_3UL>::
            generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:94:32)>
            ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar5,2);
            local_8f8 = v_17.values[0];
            local_900[0] = (float)local_83c._0_4_;
            local_900[1] = (float)local_83c._4_4_;
            local_8c8 = v_17.values[0];
            local_8d0[0] = (float)local_83c._0_4_;
            local_8d0[1] = (float)local_83c._4_4_;
            local_908 = v_17.values[0];
            local_910[0] = (float)local_83c._0_4_;
            local_910[1] = (float)local_83c._4_4_;
            local_9a8 = v_17.values[0];
            local_9b0[0] = (float)local_83c._0_4_;
            local_9b0[1] = (float)local_83c._4_4_;
            local_99c[0] = (float)local_83c._0_4_;
            local_99c[1] = (float)local_83c._4_4_;
            local_994 = v_17.values[0];
            local_9e0.max.values[0] = (float)local_83c._0_4_;
            local_9e0.max.values[1] = (float)local_83c._4_4_;
            local_9e0.max.values[2] = v_17.values[0];
            local_710 = &local_810;
            local_810.this = pvVar11;
            local_810.bbox = &local_9e0;
            local_800 = &local_9e0;
            local_7f8 = pvVar11;
            Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_710,0)
            ;
            local_708 = local_710;
            Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_710,1)
            ;
            local_700 = local_708;
            Node<float,_3UL,_32UL,_4UL>::set_bbox::anon_class_16_2_3fddf3e4::operator()(local_708,2)
            ;
            local_6f8 = local_700;
          }
          pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&this->parents_,(size_type)node_1);
          node_1 = (value_type *)*pvVar16;
        } while (node_1 != (value_type *)0x0);
        node_1 = (value_type *)0x0;
      }
      __gnu_cxx::
      __normal_iterator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion_*,_std::vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>_>
      ::operator++(&__end0);
    }
    std::
    vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
    ::~vector((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Candidate>_>
               *)local_1180);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)local_1148);
  std::
  vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
  ::~vector((vector<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion,_std::allocator<bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::Reinsertion>_>
             *)&touched.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage);
  return;
}

Assistant:

void optimize(Executor<Derived>& executor, const Config& config) {
        auto batch_size = std::max(size_t{1},
            static_cast<size_t>(static_cast<Scalar>(bvh_.nodes.size()) * config.batch_size_ratio));
        std::vector<Reinsertion> reinsertions;
        std::vector<bool> touched(bvh_.nodes.size());

        for (size_t iter = 0; iter < config.max_iter_count; ++iter) {
            auto candidates = find_candidates(batch_size);

            std::fill(touched.begin(), touched.end(), false);
            reinsertions.resize(candidates.size());
            executor.for_each(0, candidates.size(),
                [&] (size_t begin, size_t end) {
                    for (size_t i = begin; i < end; ++i)
                        reinsertions[i] = find_reinsertion(candidates[i].node_id);
                });

            reinsertions.erase(std::remove_if(reinsertions.begin(), reinsertions.end(),
                [] (auto& r) { return r.area_diff <= 0; }), reinsertions.end());
            std::sort(reinsertions.begin(), reinsertions.end(), std::greater<>{});

            for (auto& reinsertion : reinsertions) {
                auto conflicts = get_conflicts(reinsertion.from, reinsertion.to);
                if (std::any_of(conflicts.begin(), conflicts.end(), [&] (size_t i) { return touched[i]; }))
                    continue;
                for (auto conflict : conflicts)
                    touched[conflict] = true;
                reinsert_node(reinsertion.from, reinsertion.to);
            }
        }
    }